

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

void __thiscall
nonius::junit_reporter::do_analysis_complete
          (junit_reporter *this,
          sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *analysis)

{
  void *pvVar1;
  void *pvVar2;
  void *__tmp;
  mapped_type *pmVar3;
  long lVar4;
  estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *peVar5;
  rep *prVar6;
  byte bVar7;
  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  local_98;
  rep local_80 [12];
  void *local_20;
  
  bVar7 = 0;
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ::vector(&local_98,&analysis->samples);
  peVar5 = &analysis->mean;
  prVar6 = local_80;
  for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
    *prVar6 = (peVar5->point).__r;
    peVar5 = (estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)
             ((long)peVar5 + (ulong)bVar7 * -0x10 + 8);
    prVar6 = prVar6 + (ulong)bVar7 * -2 + 1;
  }
  local_20 = (void *)0x0;
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->data,&this->current);
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ::_M_move_assign((vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                    *)pmVar3,&local_98);
  pvVar2 = local_20;
  prVar6 = local_80;
  peVar5 = &(pmVar3->analysis).mean;
  for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
    (peVar5->point).__r = *prVar6;
    prVar6 = prVar6 + (ulong)bVar7 * -2 + 1;
    peVar5 = (estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)
             ((long)peVar5 + (ulong)bVar7 * -0x10 + 8);
  }
  local_20 = (void *)0x0;
  pvVar1 = (pmVar3->failure)._M_exception_object;
  (pmVar3->failure)._M_exception_object = pvVar2;
  if (pvVar1 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (local_20 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (local_98.
      super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void do_analysis_complete(sample_analysis<fp_seconds> const& analysis) override {
            data[current] = { analysis, nullptr };
        }